

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_msa_2r(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  byte bVar1;
  uint uVar2;
  TCGContext_conflict6 *tcg_ctx_00;
  byte bVar3;
  TCGv_i32 arg3;
  TCGv_i32 arg4;
  TCGv_i32 arg;
  TCGv_i32 arg2;
  TCGv_i32 tdf;
  TCGv_i32 twt;
  TCGv_i32 tws;
  TCGv_i32 twd;
  uint8_t df;
  uint8_t wd;
  uint8_t ws;
  uint8_t wt;
  TCGContext_conflict6 *tcg_ctx;
  DisasContext_conflict6 *ctx_local;
  CPUMIPSState_conflict8 *env_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  bVar1 = *(byte *)((long)&ctx->opcode + 2);
  uVar2 = ctx->opcode;
  bVar3 = *(byte *)((long)&ctx->opcode + 2) & 3;
  arg3 = tcg_const_i32_mips64el(tcg_ctx_00,(uint)((byte)(ctx->opcode >> 6) & 0x1f));
  arg4 = tcg_const_i32_mips64el(tcg_ctx_00,(uint)((byte)(uVar2 >> 0xb) & 0x1f));
  arg = tcg_const_i32_mips64el(tcg_ctx_00,(uint)(bVar1 & 0x1f));
  arg2 = tcg_const_i32_mips64el(tcg_ctx_00,(uint)bVar3);
  uVar2 = ctx->opcode & 0xfffc003f;
  if (uVar2 == 0x7b00001e) {
    gen_helper_msa_fill_df(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,arg3,arg4);
  }
  else if (uVar2 == 0x7b04001e) {
    switch(bVar3) {
    case 0:
      gen_helper_msa_pcnt_b(tcg_ctx_00,tcg_ctx_00->cpu_env,arg3,arg4);
      break;
    case 1:
      gen_helper_msa_pcnt_h(tcg_ctx_00,tcg_ctx_00->cpu_env,arg3,arg4);
      break;
    case 2:
      gen_helper_msa_pcnt_w(tcg_ctx_00,tcg_ctx_00->cpu_env,arg3,arg4);
      break;
    case 3:
      gen_helper_msa_pcnt_d(tcg_ctx_00,tcg_ctx_00->cpu_env,arg3,arg4);
    }
  }
  else if (uVar2 == 0x7b08001e) {
    switch(bVar3) {
    case 0:
      gen_helper_msa_nloc_b(tcg_ctx_00,tcg_ctx_00->cpu_env,arg3,arg4);
      break;
    case 1:
      gen_helper_msa_nloc_h(tcg_ctx_00,tcg_ctx_00->cpu_env,arg3,arg4);
      break;
    case 2:
      gen_helper_msa_nloc_w(tcg_ctx_00,tcg_ctx_00->cpu_env,arg3,arg4);
      break;
    case 3:
      gen_helper_msa_nloc_d(tcg_ctx_00,tcg_ctx_00->cpu_env,arg3,arg4);
    }
  }
  else if (uVar2 == 0x7b0c001e) {
    switch(bVar3) {
    case 0:
      gen_helper_msa_nlzc_b(tcg_ctx_00,tcg_ctx_00->cpu_env,arg3,arg4);
      break;
    case 1:
      gen_helper_msa_nlzc_h(tcg_ctx_00,tcg_ctx_00->cpu_env,arg3,arg4);
      break;
    case 2:
      gen_helper_msa_nlzc_w(tcg_ctx_00,tcg_ctx_00->cpu_env,arg3,arg4);
      break;
    case 3:
      gen_helper_msa_nlzc_d(tcg_ctx_00,tcg_ctx_00->cpu_env,arg3,arg4);
    }
  }
  else {
    generate_exception_end(ctx,0x14);
  }
  tcg_temp_free_i32(tcg_ctx_00,arg3);
  tcg_temp_free_i32(tcg_ctx_00,arg4);
  tcg_temp_free_i32(tcg_ctx_00,arg);
  tcg_temp_free_i32(tcg_ctx_00,arg2);
  return;
}

Assistant:

static void gen_msa_2r(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
#define MASK_MSA_2R(op)     (MASK_MSA_MINOR(op) | (op & (0x1f << 21)) | \
                            (op & (0x7 << 18)))
    uint8_t wt = (ctx->opcode >> 16) & 0x1f;
    uint8_t ws = (ctx->opcode >> 11) & 0x1f;
    uint8_t wd = (ctx->opcode >> 6) & 0x1f;
    uint8_t df = (ctx->opcode >> 16) & 0x3;
    TCGv_i32 twd = tcg_const_i32(tcg_ctx, wd);
    TCGv_i32 tws = tcg_const_i32(tcg_ctx, ws);
    TCGv_i32 twt = tcg_const_i32(tcg_ctx, wt);
    TCGv_i32 tdf = tcg_const_i32(tcg_ctx, df);

    switch (MASK_MSA_2R(ctx->opcode)) {
    case OPC_FILL_df:
#if !defined(TARGET_MIPS64)
        /* Double format valid only for MIPS64 */
        if (df == DF_DOUBLE) {
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
#endif
        gen_helper_msa_fill_df(tcg_ctx, tcg_ctx->cpu_env, tdf, twd, tws); /* trs */
        break;
    case OPC_NLOC_df:
        switch (df) {
        case DF_BYTE:
            gen_helper_msa_nloc_b(tcg_ctx, tcg_ctx->cpu_env, twd, tws);
            break;
        case DF_HALF:
            gen_helper_msa_nloc_h(tcg_ctx, tcg_ctx->cpu_env, twd, tws);
            break;
        case DF_WORD:
            gen_helper_msa_nloc_w(tcg_ctx, tcg_ctx->cpu_env, twd, tws);
            break;
        case DF_DOUBLE:
            gen_helper_msa_nloc_d(tcg_ctx, tcg_ctx->cpu_env, twd, tws);
            break;
        }
        break;
    case OPC_NLZC_df:
        switch (df) {
        case DF_BYTE:
            gen_helper_msa_nlzc_b(tcg_ctx, tcg_ctx->cpu_env, twd, tws);
            break;
        case DF_HALF:
            gen_helper_msa_nlzc_h(tcg_ctx, tcg_ctx->cpu_env, twd, tws);
            break;
        case DF_WORD:
            gen_helper_msa_nlzc_w(tcg_ctx, tcg_ctx->cpu_env, twd, tws);
            break;
        case DF_DOUBLE:
            gen_helper_msa_nlzc_d(tcg_ctx, tcg_ctx->cpu_env, twd, tws);
            break;
        }
        break;
    case OPC_PCNT_df:
        switch (df) {
        case DF_BYTE:
            gen_helper_msa_pcnt_b(tcg_ctx, tcg_ctx->cpu_env, twd, tws);
            break;
        case DF_HALF:
            gen_helper_msa_pcnt_h(tcg_ctx, tcg_ctx->cpu_env, twd, tws);
            break;
        case DF_WORD:
            gen_helper_msa_pcnt_w(tcg_ctx, tcg_ctx->cpu_env, twd, tws);
            break;
        case DF_DOUBLE:
            gen_helper_msa_pcnt_d(tcg_ctx, tcg_ctx->cpu_env, twd, tws);
            break;
        }
        break;
    default:
        MIPS_INVAL("MSA instruction");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }

    tcg_temp_free_i32(tcg_ctx, twd);
    tcg_temp_free_i32(tcg_ctx, tws);
    tcg_temp_free_i32(tcg_ctx, twt);
    tcg_temp_free_i32(tcg_ctx, tdf);
}